

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printWordVectors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args)

{
  undefined1 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  istream *os;
  ostream *poVar5;
  FastText *in_RDI;
  Vector vec;
  string word;
  FastText fasttext;
  string *in_stack_00000168;
  FastText *in_stack_00000170;
  undefined7 in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  string local_d0 [16];
  string *in_stack_ffffffffffffff40;
  Vector *in_stack_ffffffffffffff48;
  FastText *in_stack_ffffffffffffff50;
  string local_a0 [160];
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI);
  if (sVar3 != 3) {
    printPrintWordVectorsUsage();
    exit(1);
  }
  ::fasttext::FastText::FastText(in_RDI);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_RDI,2);
  std::__cxx11::string::string(local_a0,(string *)pvVar4);
  ::fasttext::FastText::loadModel(in_stack_00000170,in_stack_00000168);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::string(local_d0);
  iVar2 = ::fasttext::FastText::getDimension((FastText *)0x154ec7);
  ::fasttext::Vector::Vector((Vector *)in_RDI,CONCAT44(iVar2,in_stack_ffffffffffffff08));
  while( true ) {
    os = std::operator>>((istream *)&std::cin,local_d0);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(os + *(long *)(*(long *)os + -0x18)));
    if (!(bool)uVar1) break;
    ::fasttext::FastText::getWordVector
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    poVar5 = std::operator<<((ostream *)&std::cout,local_d0);
    std::operator<<(poVar5," ");
    poVar5 = ::fasttext::operator<<
                       ((ostream *)os,(Vector *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  exit(0);
}

Assistant:

void printWordVectors(const std::vector<std::string> args) {
  if (args.size() != 3) {
    printPrintWordVectorsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string word;
  Vector vec(fasttext.getDimension());
  while (std::cin >> word) {
    fasttext.getWordVector(vec, word);
    std::cout << word << " " << vec << std::endl;
  }
  exit(0);
}